

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# javanano_primitive_field.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::javanano::PrimitiveFieldGenerator::GenerateEqualsCode
          (PrimitiveFieldGenerator *this,Printer *printer)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *variables;
  Type field_type;
  JavaType JVar1;
  char *text;
  char *text_00;
  
  field_type = FieldDescriptor::type(this->descriptor_);
  JVar1 = GetJavaType(field_type);
  if (JVar1 == JAVATYPE_STRING) {
LAB_002ac2ef:
    io::Printer::Print(printer,&this->variables_,
                       "if (this.$name$ == null) {\n  if (other.$name$ != null) {\n    return false;\n  }\n} else if (!this.$name$.equals(other.$name$)"
                      );
    text_00 = ") {\n  return false;\n}\n";
    if (((this->super_FieldGenerator).params_)->generate_has_ != true) goto LAB_002ac32b;
    text = 
    "\n    || (this.$name$.equals($default$)\n        && this.has$capitalized_name$ != other.has$capitalized_name$)"
    ;
  }
  else if (JVar1 == JAVATYPE_BYTES) {
    io::Printer::Print(printer,&this->variables_,
                       "if (!java.util.Arrays.equals(this.$name$, other.$name$)");
    text_00 = ") {\n  return false;\n}\n";
    if (((this->super_FieldGenerator).params_)->generate_has_ != true) goto LAB_002ac32b;
    text = 
    "\n    || (java.util.Arrays.equals(this.$name$, $default$)\n        && this.has$capitalized_name$ != other.has$capitalized_name$)"
    ;
  }
  else {
    if (((this->super_FieldGenerator).params_)->use_reference_types_for_primitives_ == true)
    goto LAB_002ac2ef;
    variables = &this->variables_;
    if (JVar1 == JAVATYPE_DOUBLE) {
      io::Printer::Print(printer,variables,
                         "{\n  long bits = java.lang.Double.doubleToLongBits(this.$name$);\n  if (bits != java.lang.Double.doubleToLongBits(other.$name$)"
                        );
      text_00 = ") {\n    return false;\n  }\n}\n";
      if (((this->super_FieldGenerator).params_)->generate_has_ != true) goto LAB_002ac32b;
      text = 
      "\n      || (bits == java.lang.Double.doubleToLongBits($default$)\n          && this.has$capitalized_name$ != other.has$capitalized_name$)"
      ;
    }
    else if (JVar1 == JAVATYPE_FLOAT) {
      io::Printer::Print(printer,variables,
                         "{\n  int bits = java.lang.Float.floatToIntBits(this.$name$);\n  if (bits != java.lang.Float.floatToIntBits(other.$name$)"
                        );
      text_00 = ") {\n    return false;\n  }\n}\n";
      if (((this->super_FieldGenerator).params_)->generate_has_ != true) goto LAB_002ac32b;
      text = 
      "\n      || (bits == java.lang.Float.floatToIntBits($default$)\n          && this.has$capitalized_name$ != other.has$capitalized_name$)"
      ;
    }
    else {
      io::Printer::Print(printer,variables,"if (this.$name$ != other.$name$");
      text_00 = ") {\n  return false;\n}\n";
      if (((this->super_FieldGenerator).params_)->generate_has_ != true) goto LAB_002ac32b;
      text = 
      "\n    || (this.$name$ == $default$\n        && this.has$capitalized_name$ != other.has$capitalized_name$)"
      ;
    }
  }
  io::Printer::Print(printer,&this->variables_,text);
LAB_002ac32b:
  io::Printer::Print(printer,text_00);
  return;
}

Assistant:

void PrimitiveFieldGenerator::
GenerateEqualsCode(io::Printer* printer) const {
  // We define equality as serialized form equality. If generate_has(),
  // then if the field value equals the default value in both messages,
  // but one's 'has' field is set and the other's is not, the serialized
  // forms are different and we should return false.
  JavaType java_type = GetJavaType(descriptor_);
  if (java_type == JAVATYPE_BYTES) {
    printer->Print(variables_,
      "if (!java.util.Arrays.equals(this.$name$, other.$name$)");
    if (params_.generate_has()) {
      printer->Print(variables_,
        "\n"
        "    || (java.util.Arrays.equals(this.$name$, $default$)\n"
        "        && this.has$capitalized_name$ != other.has$capitalized_name$)");
    }
    printer->Print(") {\n"
      "  return false;\n"
      "}\n");
  } else if (java_type == JAVATYPE_STRING
      || params_.use_reference_types_for_primitives()) {
    printer->Print(variables_,
      "if (this.$name$ == null) {\n"
      "  if (other.$name$ != null) {\n"
      "    return false;\n"
      "  }\n"
      "} else if (!this.$name$.equals(other.$name$)");
    if (params_.generate_has()) {
      printer->Print(variables_,
        "\n"
        "    || (this.$name$.equals($default$)\n"
        "        && this.has$capitalized_name$ != other.has$capitalized_name$)");
    }
    printer->Print(") {\n"
      "  return false;\n"
      "}\n");
  } else if (java_type == JAVATYPE_FLOAT) {
    printer->Print(variables_,
      "{\n"
      "  int bits = java.lang.Float.floatToIntBits(this.$name$);\n"
      "  if (bits != java.lang.Float.floatToIntBits(other.$name$)");
    if (params_.generate_has()) {
      printer->Print(variables_,
        "\n"
        "      || (bits == java.lang.Float.floatToIntBits($default$)\n"
        "          && this.has$capitalized_name$ != other.has$capitalized_name$)");
    }
    printer->Print(") {\n"
      "    return false;\n"
      "  }\n"
      "}\n");
  } else if (java_type == JAVATYPE_DOUBLE) {
    printer->Print(variables_,
      "{\n"
      "  long bits = java.lang.Double.doubleToLongBits(this.$name$);\n"
      "  if (bits != java.lang.Double.doubleToLongBits(other.$name$)");
    if (params_.generate_has()) {
      printer->Print(variables_,
        "\n"
        "      || (bits == java.lang.Double.doubleToLongBits($default$)\n"
        "          && this.has$capitalized_name$ != other.has$capitalized_name$)");
    }
    printer->Print(") {\n"
      "    return false;\n"
      "  }\n"
      "}\n");
  } else {
    printer->Print(variables_,
      "if (this.$name$ != other.$name$");
    if (params_.generate_has()) {
      printer->Print(variables_,
        "\n"
        "    || (this.$name$ == $default$\n"
        "        && this.has$capitalized_name$ != other.has$capitalized_name$)");
    }
    printer->Print(") {\n"
      "  return false;\n"
      "}\n");
  }
}